

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O3

LinkedTargetDirs * __thiscall
cmCommonTargetGenerator::GetLinkedTargetDirectories
          (LinkedTargetDirs *__return_storage_ptr__,cmCommonTargetGenerator *this,string *lang,
          string *config)

{
  cmGlobalCommonGenerator *pcVar1;
  pointer pIVar2;
  cmLocalCommonGenerator *this_00;
  pointer ppcVar3;
  int *piVar4;
  cmComputeLinkInformation *this_01;
  ItemVector *pIVar5;
  cmGeneratorTarget *linkee;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar6;
  _Rb_tree_node_base *p_Var7;
  pointer pIVar8;
  pointer ppcVar9;
  anon_class_56_7_aa25191b addLinkedTarget;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  direct_emitted;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  forward_emitted;
  undefined1 local_f8 [48];
  anon_class_56_7_aa25191b local_c8;
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  local_90;
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  local_60;
  
  (__return_storage_ptr__->Forward).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Forward).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->Direct).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->Forward).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Direct).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Direct).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar1 = this->GlobalCommonGenerator;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  this_01 = cmGeneratorTarget::GetLinkInformation(this->GeneratorTarget,config);
  if (this_01 != (cmComputeLinkInformation *)0x0) {
    local_c8.direct_emitted =
         (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *)&local_90;
    local_c8.forward_emitted =
         (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *)&local_60;
    local_c8.this = this;
    local_c8.lang = lang;
    local_c8.config = config;
    local_c8.dirs = __return_storage_ptr__;
    local_c8.gg = pcVar1;
    pIVar5 = cmComputeLinkInformation::GetItems(this_01);
    pIVar8 = (pIVar5->
             super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pIVar2 = (pIVar5->
             super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pIVar8 != pIVar2) {
      do {
        if (pIVar8->Target == (cmGeneratorTarget *)0x0) {
          if (((pIVar8->ObjectSource != (cmSourceFile *)0x0) && (lang->_M_string_length == 7)) &&
             (piVar4 = (int *)(lang->_M_dataplus)._M_p,
             *(int *)((long)piVar4 + 3) == 0x6e617274 && *piVar4 == 0x74726f46)) {
            this_00 = this->LocalCommonGenerator;
            cmSourceFile::GetObjectLibrary_abi_cxx11_((string *)local_f8,pIVar8->ObjectSource);
            linkee = cmLocalGenerator::FindGeneratorTargetToUse
                               (&this_00->super_cmLocalGenerator,(string *)local_f8);
            GetLinkedTargetDirectories::anon_class_56_7_aa25191b::operator()(&local_c8,linkee,Yes);
            if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
              operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
            }
          }
        }
        else {
          GetLinkedTargetDirectories::anon_class_56_7_aa25191b::operator()
                    (&local_c8,pIVar8->Target,No);
        }
        pIVar8 = pIVar8 + 1;
      } while (pIVar8 != pIVar2);
    }
    pvVar6 = cmComputeLinkInformation::GetExternalObjectTargets(this_01);
    ppcVar9 = (pvVar6->
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppcVar3 = (pvVar6->
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar9 != ppcVar3) {
      do {
        GetLinkedTargetDirectories::anon_class_56_7_aa25191b::operator()(&local_c8,*ppcVar9,No);
        ppcVar9 = ppcVar9 + 1;
      } while (ppcVar9 != ppcVar3);
    }
    if ((lang->_M_string_length == 7) &&
       (piVar4 = (int *)(lang->_M_dataplus)._M_p,
       *(int *)((long)piVar4 + 3) == 0x6e617274 && *piVar4 == 0x74726f46)) {
      cmGeneratorTarget::GetSourceObjectLibraries
                ((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  *)local_f8,this->GeneratorTarget,config);
      if ((_Rb_tree_node_base *)local_f8._24_8_ != (_Rb_tree_node_base *)(local_f8 + 8)) {
        p_Var7 = (_Rb_tree_node_base *)local_f8._24_8_;
        do {
          GetLinkedTargetDirectories::anon_class_56_7_aa25191b::operator()
                    (&local_c8,*(cmGeneratorTarget **)(p_Var7 + 1),Yes);
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
        } while (p_Var7 != (_Rb_tree_node_base *)(local_f8 + 8));
      }
      std::
      _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
      ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                   *)local_f8);
    }
  }
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

cmCommonTargetGenerator::LinkedTargetDirs
cmCommonTargetGenerator::GetLinkedTargetDirectories(
  const std::string& lang, const std::string& config) const
{
  LinkedTargetDirs dirs;
  std::set<cmGeneratorTarget const*> forward_emitted;
  std::set<cmGeneratorTarget const*> direct_emitted;
  cmGlobalCommonGenerator* const gg = this->GlobalCommonGenerator;

  enum class Forwarding
  {
    Yes,
    No
  };

  if (cmComputeLinkInformation* cli =
        this->GeneratorTarget->GetLinkInformation(config)) {
    auto addLinkedTarget =
      [this, &lang, &config, &dirs, &direct_emitted, &forward_emitted,
       gg](cmGeneratorTarget const* linkee, Forwarding forward) {
        if (linkee &&
            !linkee->IsImported()
            // Skip targets that build after this one in a static lib cycle.
            && gg->TargetOrderIndexLess(linkee, this->GeneratorTarget)
            // We can ignore the INTERFACE_LIBRARY items because
            // Target->GetLinkInformation already processed their
            // link interface and they don't have any output themselves.
            && (linkee->GetType() != cmStateEnums::INTERFACE_LIBRARY
                // Synthesized targets may have relevant rules.
                || linkee->IsSynthetic()) &&
            ((lang == "CXX"_s && linkee->HaveCxx20ModuleSources()) ||
             (lang == "Fortran"_s && linkee->HaveFortranSources(config)))) {
          cmLocalGenerator* lg = linkee->GetLocalGenerator();
          std::string di = cmStrCat(lg->GetCurrentBinaryDirectory(), '/',
                                    lg->GetTargetDirectory(linkee));
          if (lg->GetGlobalGenerator()->IsMultiConfig()) {
            di = cmStrCat(di, '/', config);
          }
          if (forward == Forwarding::Yes &&
              forward_emitted.insert(linkee).second) {
            dirs.Forward.push_back(di);
          }
          if (direct_emitted.insert(linkee).second) {
            dirs.Direct.emplace_back(di);
          }
        }
      };
    for (auto const& item : cli->GetItems()) {
      if (item.Target) {
        addLinkedTarget(item.Target, Forwarding::No);
      } else if (item.ObjectSource && lang == "Fortran"_s
                 /* Object source files do not have a language associated with
                    them. */
                 /* && item.ObjectSource->GetLanguage() == "Fortran"_s*/) {
        // Fortran modules provided by `$<TARGET_OBJECTS>` as linked items
        // should be collated for use in this target.
        addLinkedTarget(this->LocalCommonGenerator->FindGeneratorTargetToUse(
                          item.ObjectSource->GetObjectLibrary()),
                        Forwarding::Yes);
      }
    }
    for (cmGeneratorTarget const* target : cli->GetExternalObjectTargets()) {
      addLinkedTarget(target, Forwarding::No);
    }
    if (lang == "Fortran"_s) {
      // Fortran modules provided by `$<TARGET_OBJECTS>` as sources should be
      // collated for use in this target.
      for (cmGeneratorTarget const* target :
           this->GeneratorTarget->GetSourceObjectLibraries(config)) {
        addLinkedTarget(target, Forwarding::Yes);
      }
    }
  }
  return dirs;
}